

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop.c
# Opt level: O3

void thread_guard(Fiber *self,void *arg)

{
  Thread *pTVar1;
  Thread *to;
  undefined8 *in_RAX;
  char *pcVar2;
  CleanupArgs *args;
  undefined8 *local_18;
  
  if (the_thread == (Thread *)0x0) {
    pcVar2 = "the_thread";
  }
  else if (the_thread == (Thread *)arg) {
    if ((Fiber *)((long)arg + 0x18) == self) {
      local_18 = in_RAX;
      fiber_reserve_return((Fiber *)(*arg + 0x18),thread_cleanup_cont,&local_18,8);
      *local_18 = arg;
      pTVar1 = *(Thread **)((long)arg + 8);
      to = *(Thread **)((long)arg + 0x10);
      pTVar1->next = to;
      to->prev = pTVar1;
      thread_switch((Thread *)arg,to);
      abort();
    }
    pcVar2 = "self == &th->fiber";
  }
  else {
    pcVar2 = "th == the_thread";
  }
  fprintf(_stderr,"requirement not met: %s\n",pcVar2);
  abort();
}

Assistant:

static void
thread_guard(Fiber *self, void *arg)
{
    Thread *th = (Thread *) arg;
    require(the_thread);
    require(th == the_thread);
    require(self == &th->fiber);
    (void) self;

    Sched *sched = th->sched;
    Thread *sched_thread = &sched->main_thread;
    CleanupArgs *args;

    fiber_reserve_return(
      &sched_thread->fiber, thread_cleanup_cont, (void **) &args, sizeof args);
    args->thread = th;

    Thread *next = th->next;
    // unlink ourself
    th->prev->next = th->next;
    th->next->prev = th->prev;
    thread_switch(th, next);
    // does not return here
    abort();
}